

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O3

string * getCommonCodeGen<std::__cxx11::string>
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *vals,vector<int,_std::allocator<int>_> *mapping,size_t n,string *map_name,
                   bool nonKeyLookups)

{
  pointer pbVar1;
  unsigned_long *__val;
  ulong __val_00;
  bool bVar2;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  long *plVar9;
  unsigned_long **ppuVar10;
  ulong *puVar11;
  pointer pcVar12;
  unsigned_long *puVar13;
  size_t sVar14;
  ulong uVar15;
  undefined8 uVar16;
  char cVar17;
  char cVar18;
  string *val;
  size_type sVar19;
  pointer pbVar20;
  ulong uVar21;
  int *val_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  int *piVar23;
  string *val_1;
  pointer pcVar24;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<int,_std::allocator<int>_> *__range1_1;
  string upper_name;
  size_t num_chars;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string *local_120;
  size_t local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  long lStack_f0;
  unsigned_long **local_e8;
  iterator iStack_e0;
  unsigned_long *local_d8;
  long lStack_d0;
  vector<int,_std::allocator<int>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  undefined7 *local_70;
  undefined8 local_68;
  undefined7 local_60;
  undefined4 uStack_59;
  undefined1 local_55;
  undefined7 *local_50;
  undefined8 local_48;
  undefined7 local_40;
  undefined4 uStack_39;
  undefined1 local_35;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar24 = (map_name->_M_dataplus)._M_p;
  local_118 = n;
  local_110 = vals;
  local_c8 = mapping;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar24,pcVar24 + map_name->_M_string_length);
  _Var4._M_p = local_c0._M_dataplus._M_p;
  if (local_c0._M_string_length != 0) {
    sVar19 = 0;
    do {
      iVar5 = toupper((int)_Var4._M_p[sVar19]);
      _Var4._M_p[sVar19] = (char)iVar5;
      sVar19 = sVar19 + 1;
    } while (local_c0._M_string_length != sVar19);
  }
  std::operator+(&local_140,"//CODEGEN FILE\n#ifndef POIFECT_",&local_c0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160.field_2._8_8_ = plVar6[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_160._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)local_c0._M_dataplus._M_p);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar6[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar3 = plVar6[3];
    local_80->_M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_78 = keys;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_120 = __return_storage_ptr__;
  std::operator+(&local_a0,"class ",map_name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
  ppuVar10 = (unsigned_long **)(plVar6 + 2);
  if ((unsigned_long **)*plVar6 == ppuVar10) {
    local_d8 = *ppuVar10;
    lStack_d0 = plVar6[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *ppuVar10;
    local_e8 = (unsigned_long **)*plVar6;
  }
  iStack_e0._M_current = (unsigned_long *)plVar6[1];
  *plVar6 = (long)ppuVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_40 = 0x74733a3a647473;
  uStack_39 = 0x676e6972;
  local_48 = 0xb;
  local_35 = 0;
  local_50 = &local_40;
  std::__cxx11::string::compare((char *)&local_50);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  plVar9 = plVar6 + 2;
  if ((pointer *)*plVar6 == (pointer *)plVar9) {
    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
    lStack_f0 = plVar6[3];
  }
  else {
    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
    local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar6;
  }
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_140.field_2._M_allocated_capacity = *puVar11;
    local_140.field_2._8_8_ = plVar6[3];
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *puVar11;
    local_140._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_140._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_60 = 0x74733a3a647473;
  uStack_59 = 0x676e6972;
  local_68 = 0xb;
  local_55 = 0;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    uVar16 = local_140.field_2._M_allocated_capacity;
  }
  local_70 = &local_60;
  if ((local_140._M_string_length + 0xb < 0x10) &&
     ((ulong)uVar16 < local_140._M_string_length + 0xb)) {
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_70,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
  }
  else {
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)&local_60);
  }
  psVar8 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160.field_2._8_8_ = puVar7[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_160._M_string_length = puVar7[1];
  *puVar7 = psVar8;
  puVar7[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar6[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT17((undefined1)uStack_59,local_60) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT17((undefined1)uStack_39,local_40) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,(long)local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  writeKeys(__return_storage_ptr__,local_78,local_c8,local_118);
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_a0._M_dataplus._M_p = (pointer)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_d8 = (unsigned_long *)0x0;
  local_e8 = (unsigned_long **)0x0;
  iStack_e0._M_current = (unsigned_long *)0x0;
  pbVar20 = (local_110->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (local_110->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar20 == pbVar1) {
    pcVar24 = (pointer)0x1;
  }
  else {
    do {
      if (iStack_e0._M_current == local_d8) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,iStack_e0,
                   (unsigned_long *)&local_a0);
      }
      else {
        *iStack_e0._M_current = (unsigned_long)local_a0._M_dataplus._M_p;
        iStack_e0._M_current = iStack_e0._M_current + 1;
      }
      local_180 = (long *)pbVar20->_M_string_length;
      local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p + (long)local_180;
      if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_108,
                   (iterator)
                   local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_180);
      }
      else {
        *local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_180;
        local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar1);
    pcVar24 = local_a0._M_dataplus._M_p + 1;
    if ((pointer)0x9 < pcVar24) {
      pcVar12 = pcVar24;
      cVar17 = '\x04';
      do {
        cVar18 = cVar17;
        if (pcVar12 < (pointer)0x64) {
          cVar18 = cVar18 + -2;
          goto LAB_00110e56;
        }
        if (pcVar12 < (pointer)0x3e8) {
          cVar18 = cVar18 + -1;
          goto LAB_00110e56;
        }
        if (pcVar12 < (pointer)0x2710) goto LAB_00110e56;
        bVar2 = (pointer)0x1869f < pcVar12;
        pcVar12 = (pointer)((ulong)pcVar12 / 10000);
        cVar17 = cVar18 + '\x04';
      } while (bVar2);
      cVar18 = cVar18 + '\x01';
      goto LAB_00110e56;
    }
  }
  cVar18 = '\x01';
LAB_00110e56:
  paVar22 = &local_160.field_2;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_140,cVar18);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,(unsigned_long)pcVar24);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x11749f);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160.field_2._8_8_ = plVar6[3];
    local_160._M_dataplus._M_p = (pointer)paVar22;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_160._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar6[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar22) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  pbVar20 = (local_110->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (local_110->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar20 != pbVar1) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      cVar17 = '\b';
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        cVar17 = cVar17 + -1;
      } while (cVar17 != '\0');
      std::operator+(&local_160,'\"',pbVar20);
      plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_160,local_160._M_string_length,0,'\x01');
      local_180 = &local_170;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_170 = *plVar9;
        lStack_168 = plVar6[3];
      }
      else {
        local_170 = *plVar9;
        local_180 = (long *)*plVar6;
      }
      local_178 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar22) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 != pbVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_118 = local_118 + 1;
  cVar17 = '\x01';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  if (9 < local_118) {
    uVar21 = local_118;
    cVar18 = '\x04';
    do {
      cVar17 = cVar18;
      if (uVar21 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0011110b;
      }
      if (uVar21 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0011110b;
      }
      if (uVar21 < 10000) goto LAB_0011110b;
      bVar2 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      cVar18 = cVar17 + '\x04';
    } while (bVar2);
    cVar17 = cVar17 + '\x01';
  }
LAB_0011110b:
  std::__cxx11::string::_M_construct((ulong)&local_140,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,local_118);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x116126);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160.field_2._8_8_ = plVar6[3];
    local_160._M_dataplus._M_p = (pointer)paVar22;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_160._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar6[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar22) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  piVar23 = (local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)piVar23 != local_110) {
    uVar21 = 0;
    do {
      if ((uVar21 != 0) && (uVar21 == (uVar21 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((long)*piVar23 == -1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        __val = local_e8[*piVar23];
        cVar17 = '\x01';
        if ((unsigned_long *)0x9 < __val) {
          puVar13 = __val;
          cVar18 = '\x04';
          do {
            cVar17 = cVar18;
            if (puVar13 < (unsigned_long *)0x64) {
              cVar17 = cVar17 + -2;
              goto LAB_0011131d;
            }
            if (puVar13 < (unsigned_long *)0x3e8) {
              cVar17 = cVar17 + -1;
              goto LAB_0011131d;
            }
            if (puVar13 < (unsigned_long *)0x2710) goto LAB_0011131d;
            bVar2 = (unsigned_long *)0x1869f < puVar13;
            puVar13 = (unsigned_long *)((ulong)puVar13 / 10000);
            cVar18 = cVar17 + '\x04';
          } while (bVar2);
          cVar17 = cVar17 + '\x01';
        }
LAB_0011131d:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,(unsigned_long)__val)
        ;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_180 = &local_170;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_170 = *plVar9;
          lStack_168 = plVar6[3];
        }
        else {
          local_170 = *plVar9;
          local_180 = (long *)*plVar6;
        }
        local_178 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      uVar21 = uVar21 + 1;
      piVar23 = piVar23 + 1;
    } while ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)piVar23 != local_110);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar17 = '\x01';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  if (9 < local_118) {
    sVar14 = local_118;
    cVar18 = '\x04';
    do {
      cVar17 = cVar18;
      if (sVar14 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0011146c;
      }
      if (sVar14 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0011146c;
      }
      if (sVar14 < 10000) goto LAB_0011146c;
      bVar2 = 99999 < sVar14;
      sVar14 = sVar14 / 10000;
      cVar18 = cVar17 + '\x04';
    } while (bVar2);
    cVar17 = cVar17 + '\x01';
  }
LAB_0011146c:
  std::__cxx11::string::_M_construct((ulong)&local_140,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,local_118);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x116126);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160.field_2._8_8_ = plVar6[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar8;
    local_160._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_160._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_170 = *plVar9;
    lStack_168 = plVar6[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar9;
    local_180 = (long *)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  piVar23 = (local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)piVar23 != local_110) {
    uVar21 = 0;
    do {
      if ((uVar21 != 0) && (uVar21 == (uVar21 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((long)*piVar23 == -1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        __val_00 = local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar23];
        cVar17 = '\x01';
        if (9 < __val_00) {
          uVar15 = __val_00;
          cVar18 = '\x04';
          do {
            cVar17 = cVar18;
            if (uVar15 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00111682;
            }
            if (uVar15 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00111682;
            }
            if (uVar15 < 10000) goto LAB_00111682;
            bVar2 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar18 = cVar17 + '\x04';
          } while (bVar2);
          cVar17 = cVar17 + '\x01';
        }
LAB_00111682:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,__val_00);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
        __return_storage_ptr__ = local_120;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_170 = *plVar9;
          lStack_168 = plVar6[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar9;
          local_180 = (long *)*plVar6;
        }
        local_178 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_120,(ulong)local_180);
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      uVar21 = uVar21 + 1;
      piVar23 = piVar23 + 1;
    } while ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)piVar23 != local_110);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_e8 != (unsigned_long **)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCommonCodeGen(const std::vector<KeyType>& keys,
                             const std::vector<std::string> vals,
                             const std::vector<int>& mapping,
                             size_t n,
                             std::string map_name,
                             bool nonKeyLookups){
    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);

    std::string str = "//CODEGEN FILE\n"
                      "#ifndef POIFECT_" + upper_name + "_H\n"
                      "#define POIFECT_" + upper_name + "_H\n"
                      "#include <array>\n";

    if(!nonKeyLookups) str += "#include <cassert>\n";

    str += "#include <limits>\n"
           "#include <string>\n\n";

    str += "class " + map_name + " final{\n"
    "public:\n"
    "    static " + (typeStr(keys[0])!="std::string" ? "constexpr " : "")
            + "std::string_view lookup(const " + typeStr(keys[0]) + "& key) noexcept;\n"
    "\n"
    "private:\n";

    if(!nonKeyLookups) str += "    #ifndef NDEBUG\n";
    writeKeys(str, keys, mapping, n);
    if(!nonKeyLookups) str += "    #endif\n";
    str += "\n";

    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& val : vals){
        start.push_back(num_chars);
        num_chars += val.size();
        sze.push_back(val.size());
    }

    str += "    static constexpr char flat_vals[" + std::to_string(num_chars+1) + "] = ";
    for(const std::string& val : vals){
        str.push_back('\n');
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        str += '"' + val + '"';
    }
    str += ";\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    return str;
}